

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_ar.c
# Opt level: O1

int archive_read_format_ar_bid(archive_read *a,int best_bid)

{
  uint uVar1;
  long *plVar2;
  
  plVar2 = (long *)__archive_read_ahead(a,8,(ssize_t *)0x0);
  if (plVar2 == (long *)0x0) {
    uVar1 = 0xffffffff;
  }
  else {
    uVar1 = -(uint)(*plVar2 != 0xa3e686372613c21) | 0x40;
  }
  return uVar1;
}

Assistant:

static int
archive_read_format_ar_bid(struct archive_read *a, int best_bid)
{
	const void *h;

	(void)best_bid; /* UNUSED */

	/*
	 * Verify the 8-byte file signature.
	 * TODO: Do we need to check more than this?
	 */
	if ((h = __archive_read_ahead(a, 8, NULL)) == NULL)
		return (-1);
	if (memcmp(h, "!<arch>\n", 8) == 0) {
		return (64);
	}
	return (-1);
}